

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<henson::PythonPuppet>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/puppet.cpp:58:30)>
::do_call(Proxy_Function_Callable_Impl<std::shared_ptr<henson::PythonPuppet>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap_*),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_puppet_cpp:58:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  Type_Conversions_State *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  CommandLine cmd_line;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  Result_Type local_b8;
  pointer local_98;
  string local_90;
  string local_70;
  CommandLine local_50;
  
  boxed_cast<std::__cxx11::string>
            ((Result_Type *)(local_c0 + 8),(chaiscript *)(t_conversions->m_conversions)._M_data,
             (Boxed_Value *)in_RCX,in_RCX);
  local_c0 = (undefined1  [8])
             boxed_cast<henson::ProcMap*>
                       ((Boxed_Value *)
                        ((long)&(((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.
                                super___mutex_base._M_mutex + 0x10),in_RCX);
  henson::CommandLine::CommandLine(&local_50,(string *)(local_c0 + 8));
  std::__cxx11::string::string((string *)&local_90,(string *)(params + 2));
  henson::CommandLine::executable(&local_70,&local_50,&local_90);
  local_98 = params[1].
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  make_shared<henson::PythonPuppet,std::__cxx11::string,std::vector<char*,std::allocator<char*>>&,henson::ProcMap*&,henson::NameMap*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
             (vector<char_*,_std::allocator<char_*>_> *)&local_70,(ProcMap **)&local_50.argv,
             (NameMap **)local_c0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  henson::CommandLine::~CommandLine(&local_50);
  std::__cxx11::string::~string((string *)(local_c0 + 8));
  detail::Handle_Return<std::shared_ptr<henson::PythonPuppet>_>::handle
            ((Handle_Return<std::shared_ptr<henson::PythonPuppet>_> *)this,
             (shared_ptr<henson::PythonPuppet> *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }